

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivUpdatePointers(Gia_Man_t *p,Gia_Man_t *pNew)

{
  int v;
  Gia_Obj_t *pGVar1;
  Gia_Obj_t *pGVar2;
  int i;
  int v_00;
  
  v_00 = 0;
  while( true ) {
    if (p->nObjs <= v_00) {
      return;
    }
    pGVar1 = Gia_ManObj(p,v_00);
    if (pGVar1 == (Gia_Obj_t *)0x0) break;
    if (pGVar1->Value != 0xffffffff) {
      v = Abc_Lit2Var(pGVar1->Value);
      pGVar2 = Gia_ManObj(pNew,v);
      if ((pGVar2->field_0x3 & 0x40) != 0) {
        pGVar1->Value = 0xffffffff;
      }
    }
    v_00 = v_00 + 1;
  }
  return;
}

Assistant:

void Gia_ManEquivUpdatePointers( Gia_Man_t * p, Gia_Man_t * pNew )
{
    Gia_Obj_t * pObj, * pObjNew;
    int i;
    Gia_ManForEachObj( p, pObj, i )
    {
        if ( !~pObj->Value )
            continue;
        pObjNew = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        if ( pObjNew->fMark0 )
            pObj->Value = ~0;
    }
}